

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzysmp.cpp
# Opt level: O1

void __thiscall
TPZFYsmpMatrix<std::complex<double>_>::AddKel
          (TPZFYsmpMatrix<std::complex<double>_> *this,TPZFMatrix<std::complex<double>_> *elmat,
          TPZVec<long> *destinationindex)

{
  double *pdVar1;
  long lVar2;
  long lVar3;
  long *plVar4;
  complex<double> *pcVar5;
  complex<double> *pcVar6;
  double dVar7;
  bool bVar8;
  long lVar9;
  ostream *poVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  double in_XMM1_Qa;
  double dVar14;
  long local_70;
  
  if (0 < (elmat->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow) {
    local_70 = 0;
    lVar13 = 0;
    do {
      if (0 < (elmat->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow) {
        lVar12 = 0;
        dVar14 = in_XMM1_Qa;
        do {
          lVar2 = destinationindex->fStore[local_70];
          lVar3 = destinationindex->fStore[lVar12];
          (*(elmat->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x24])(elmat,local_70,lVar12);
          dVar7 = cabs((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
          in_XMM1_Qa = 1e-12;
          if (1e-12 <= ABS(dVar7)) {
            lVar11 = lVar13 + 1;
            plVar4 = (this->fIA).fStore;
            lVar9 = plVar4[lVar2];
            if (((lVar11 < lVar9) || (plVar4[lVar2 + 1] <= lVar11)) ||
               ((this->fJA).fStore[lVar13 + 1] != lVar3)) {
              lVar2 = plVar4[lVar2 + 1];
              lVar13 = lVar9;
              bVar8 = true;
              if (lVar9 < lVar2) {
                plVar4 = (this->fJA).fStore;
                lVar11 = lVar9 * 8;
                do {
                  lVar13 = *(long *)((long)plVar4 + lVar11);
                  if ((lVar13 == lVar3) || (lVar13 == -1)) {
                    if (lVar13 == -1) {
                      *(long *)((long)plVar4 + lVar11) = lVar3;
                      pcVar6 = (this->fA).fStore;
                      *(ulong *)(pcVar6->_M_value + lVar11 * 2) =
                           CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
                      *(double *)(pcVar6->_M_value + lVar11 * 2 + 8) = dVar14;
                    }
                    else {
                      pcVar6 = (this->fA).fStore;
                      pdVar1 = (double *)(pcVar6->_M_value + lVar11 * 2);
                      dVar7 = pdVar1[1];
                      in_XMM1_Qa = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) + *pdVar1;
                      pdVar1 = (double *)(pcVar6->_M_value + lVar11 * 2);
                      *pdVar1 = in_XMM1_Qa;
                      pdVar1[1] = dVar14 + dVar7;
                    }
                    lVar13 = lVar9;
                    bVar8 = false;
                    break;
                  }
                  lVar9 = lVar9 + 1;
                  lVar11 = lVar11 + 8;
                  lVar13 = lVar2;
                  bVar8 = true;
                } while (lVar2 != lVar9);
              }
            }
            else {
              pcVar5 = (this->fA).fStore;
              pcVar6 = pcVar5 + lVar11;
              dVar7 = *(double *)(pcVar6->_M_value + 8);
              in_XMM1_Qa = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) +
                           *(double *)pcVar6->_M_value;
              pcVar5 = pcVar5 + lVar11;
              *(double *)pcVar5->_M_value = in_XMM1_Qa;
              *(double *)(pcVar5->_M_value + 8) = dVar14 + dVar7;
              lVar13 = lVar11;
              bVar8 = false;
            }
            if (bVar8) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,
                         "TPZFYsmpMatrix::AddKel: Non existing position on sparse matrix: line =",
                         0x46);
              poVar10 = std::ostream::_M_insert<long>((long)&std::cout);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10," column =",9);
              poVar10 = std::ostream::_M_insert<long>((long)poVar10);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
              std::ostream::put((char)poVar10);
              std::ostream::flush();
            }
          }
          lVar12 = lVar12 + 1;
          dVar14 = in_XMM1_Qa;
        } while (lVar12 < (elmat->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow);
      }
      local_70 = local_70 + 1;
    } while (local_70 < (elmat->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow);
  }
  return;
}

Assistant:

void TPZFYsmpMatrix<TVar>::AddKel(TPZFMatrix<TVar> & elmat, TPZVec<int64_t> & destinationindex){
    int64_t i,j,k = 0;
    TVar value=0.;
    int64_t ipos,jpos;
    for(i=0;i<elmat.Rows();i++){
        for(j=0;j<elmat.Rows();j++){
            ipos=destinationindex[i];
            jpos=destinationindex[j];
            value=elmat.GetVal(i,j);
            //cout << "j= " << j << endl;
            if(!IsZero(value)){
                //cout << "fIA[ipos] " << fIA[ipos] << "     fIA[ipos+1] " << fIA[ipos+1] << endl;
                int flag = 0;
				k++;
				if(k >= fIA[ipos] && k < fIA[ipos+1] && fJA[k]==jpos)
				{ // OK -> elements in sequence
					fA[k]+=value;
					flag = 1;
				}else
				{
					for(k=fIA[ipos];k<fIA[ipos+1];k++){
						if(fJA[k]==jpos || fJA[k]==-1){
							//cout << "fJA[k] " << fJA[k] << " jpos "<< jpos << "   " << value << endl;
							//cout << "k " << k << "   "<< jpos << "   " << value << endl;
							flag=1;
							if(fJA[k]==-1){
								fJA[k]=jpos;
								fA[k]=value;
								// cout << jpos << "   " << value << endl;
								break;
							}else{
								fA[k]+=value;
								break;
							}
						}
					}
				}
                if(!flag) cout << "TPZFYsmpMatrix::AddKel: Non existing position on sparse matrix: line =" << ipos << " column =" << jpos << endl;         }
        }
    }
}